

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::do_sort(cb_explore_adf *data)

{
  action_score *__first;
  action_score *__last;
  pointer pfVar1;
  pointer pfVar2;
  pointer ppeVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pfVar8;
  pointer pfVar9;
  pointer pvVar10;
  pointer pvVar11;
  pointer pvVar12;
  pointer pvVar13;
  ulong uVar14;
  long lVar15;
  size_t *psVar16;
  size_t *psVar17;
  byte bVar18;
  action_score *local_1598;
  cb_explore_adf local_1508;
  cb_explore_adf local_12b8;
  cb_explore_adf local_1068;
  cb_explore_adf local_e10;
  cb_explore_adf local_bc0;
  cb_explore_adf local_970;
  cb_explore_adf local_720;
  cb_explore_adf local_4d0;
  cb_explore_adf local_280;
  
  bVar18 = 0;
  __first = (data->action_probs)._begin;
  __last = (data->action_probs)._end;
  cb_explore_adf::cb_explore_adf(&local_720,data);
  cb_explore_adf::cb_explore_adf(&local_bc0,&local_720);
  pvVar13 = local_bc0.ex_costs.
            super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar12 = local_bc0.ex_costs.
            super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pvVar7 = local_bc0.ex_costs.
           super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pvVar11 = local_bc0.ex_as.
            super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pvVar10 = local_bc0.ex_as.
            super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pvVar6 = local_bc0.ex_as.
           super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pfVar9 = local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pfVar8 = local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar5 = local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pfVar2 = local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar1 = local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_1068.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_1068.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_1068.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_1068.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1068.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1068.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1068.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_1068.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1068.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc0.ex_as.
  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc0.ex_as.
  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.ex_as.
  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_bc0.ex_costs.
  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_bc0.ex_costs.
  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_bc0.ex_costs.
  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1068.action_probs.end_array = local_bc0.action_probs.end_array;
  local_1068.action_probs.erase_count = local_bc0.action_probs.erase_count;
  local_1068.action_probs._begin = local_bc0.action_probs._begin;
  local_1068.action_probs._end = local_bc0.action_probs._end;
  psVar16 = &local_bc0.explore_type;
  psVar17 = &local_1068.explore_type;
  for (lVar15 = 0xe; lVar15 != 0; lVar15 = lVar15 + -1) {
    *psVar17 = *psVar16;
    psVar16 = psVar16 + (ulong)bVar18 * -2 + 1;
    psVar17 = psVar17 + (ulong)bVar18 * -2 + 1;
  }
  local_1068.gen_cs._20_8_ = local_bc0.gen_cs._20_8_;
  local_1068.gen_cs.cb_type = local_bc0.gen_cs.cb_type;
  local_1068.gen_cs.pred_scores.costs._begin = local_bc0.gen_cs.pred_scores.costs._begin;
  local_1068.gen_cs.pred_scores.costs._end = local_bc0.gen_cs.pred_scores.costs._end;
  local_1068.gen_cs.pred_scores.costs.end_array = local_bc0.gen_cs.pred_scores.costs.end_array;
  local_1068.gen_cs.pred_scores.costs.erase_count = local_bc0.gen_cs.pred_scores.costs.erase_count;
  local_1068.gen_cs.known_cost.cost = local_bc0.gen_cs.known_cost.cost;
  local_1068.gen_cs.known_cost.action = local_bc0.gen_cs.known_cost.action;
  local_1068.gen_cs.known_cost.probability = local_bc0.gen_cs.known_cost.probability;
  local_1068.gen_cs.known_cost.partial_prediction = local_bc0.gen_cs.known_cost.partial_prediction;
  local_1068.gen_cs.scorer = local_bc0.gen_cs.scorer;
  memcpy(&local_1068.cs_labels,&local_bc0.cs_labels,0xc0);
  local_1068.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = pfVar1;
  local_1068.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar2;
  local_1068.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar4;
  local_1068.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = pfVar5;
  local_1068.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = pfVar8;
  local_1068.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar9;
  local_1068.ex_as.
  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pvVar6;
  local_1068.ex_as.
  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
  local_1068.ex_as.
  super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar11;
  local_1068.ex_costs.
  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
  super__Vector_impl_data._M_start = pvVar7;
  local_1068.ex_costs.
  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pvVar12;
  local_1068.ex_costs.
  super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pvVar13;
  if (__first != __last) {
    cb_explore_adf::cb_explore_adf(&local_4d0,&local_1068);
    uVar14 = (long)__last - (long)__first >> 3;
    lVar15 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<ACTION_SCORE::action_score*,long,__gnu_cxx::__ops::_Iter_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
              (__first,__last,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                *)&local_4d0);
    if (local_4d0.ex_costs.
        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.ex_costs.
                      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4d0.ex_as.
        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.ex_as.
                      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4d0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4d0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4d0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.gen_cs.mtr_ec_seq.
                      super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_4d0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.top_actions.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4d0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4d0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cb_explore_adf::cb_explore_adf(&local_e10,&local_1068);
    if ((long)__last - (long)__first < 0x81) {
      cb_explore_adf::cb_explore_adf(&local_1508,&local_e10);
      std::
      __insertion_sort<ACTION_SCORE::action_score*,__gnu_cxx::__ops::_Iter_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                  *)&local_1508);
      if (local_1508.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1508.ex_costs.
                        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1508.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1508.ex_as.
                        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1508.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1508.max_costs.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1508.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1508.min_costs.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_1508.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1508.gen_cs.mtr_ec_seq.
                        super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_970.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_1508.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (local_1508.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1508.top_actions.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        local_970.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1508.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    else {
      cb_explore_adf::cb_explore_adf(&local_280,&local_e10);
      local_1598 = __first + 0x10;
      std::
      __insertion_sort<ACTION_SCORE::action_score*,__gnu_cxx::__ops::_Iter_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
                (__first,local_1598,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                  *)&local_280);
      if (local_280.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.ex_costs.
                        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.ex_as.
                        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.max_costs.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.min_costs.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.gen_cs.mtr_ec_seq.
                        super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_280.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.top_actions.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_280.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_280.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cb_explore_adf::cb_explore_adf(&local_970,&local_e10);
      if (local_1598 != __last) {
        do {
          cb_explore_adf::cb_explore_adf(&local_12b8,&local_970);
          pfVar2 = local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar1 = local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1508.action_probs.end_array = local_12b8.action_probs.end_array;
          local_1508.action_probs.erase_count = local_12b8.action_probs.erase_count;
          local_1508.action_probs._begin = local_12b8.action_probs._begin;
          local_1508.action_probs._end = local_12b8.action_probs._end;
          local_1508.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1508.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1508.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1508.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1508.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1508.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          psVar16 = &local_12b8.explore_type;
          psVar17 = &local_1508.explore_type;
          for (lVar15 = 0xe;
              ppeVar3 = local_12b8.gen_cs.mtr_ec_seq.
                        super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Vector_impl_data._M_start, lVar15 != 0; lVar15 = lVar15 + -1) {
            *psVar17 = *psVar16;
            psVar16 = psVar16 + (ulong)bVar18 * -2 + 1;
            psVar17 = psVar17 + (ulong)bVar18 * -2 + 1;
          }
          local_1508.gen_cs._20_8_ = local_12b8.gen_cs._20_8_;
          local_1508.gen_cs.cb_type = local_12b8.gen_cs.cb_type;
          local_1508.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               local_12b8.gen_cs.mtr_ec_seq.
               super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1508.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               local_12b8.gen_cs.mtr_ec_seq.
               super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1508.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               local_12b8.gen_cs.mtr_ec_seq.
               super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_12b8.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_12b8.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1508.gen_cs.scorer = local_12b8.gen_cs.scorer;
          local_1508.gen_cs.known_cost.cost = local_12b8.gen_cs.known_cost.cost;
          local_1508.gen_cs.known_cost.action = local_12b8.gen_cs.known_cost.action;
          local_1508.gen_cs.known_cost.probability = local_12b8.gen_cs.known_cost.probability;
          local_1508.gen_cs.known_cost.partial_prediction =
               local_12b8.gen_cs.known_cost.partial_prediction;
          local_1508.gen_cs.pred_scores.costs.end_array =
               local_12b8.gen_cs.pred_scores.costs.end_array;
          local_1508.gen_cs.pred_scores.costs.erase_count =
               local_12b8.gen_cs.pred_scores.costs.erase_count;
          local_1508.gen_cs.pred_scores.costs._begin = local_12b8.gen_cs.pred_scores.costs._begin;
          local_1508.gen_cs.pred_scores.costs._end = local_12b8.gen_cs.pred_scores.costs._end;
          memcpy(&local_1508.cs_labels,&local_12b8.cs_labels,0xc0);
          pvVar7 = local_12b8.ex_costs.
                   super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar6 = local_12b8.ex_as.
                   super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pfVar5 = local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar4 = local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1508.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1508.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1508.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1508.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_1508.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_1508.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1508.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_12b8.ex_as.
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1508.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_12b8.ex_as.
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1508.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_12b8.ex_as.
               super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_12b8.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_12b8.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1508.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_start =
               local_12b8.ex_costs.
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_1508.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_12b8.ex_costs.
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_1508.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage =
               local_12b8.ex_costs.
               super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_12b8.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_start = (pointer)0x0;
          local_12b8.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_finish = (pointer)0x0;
          local_12b8.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          __unguarded_linear_insert<ACTION_SCORE::action_score*,__gnu_cxx::__ops::_Val_comp_iter<CB_EXPLORE_ADF::do_sort(CB_EXPLORE_ADF::cb_explore_adf&)::__0>>
                    (local_1598,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_cb_explore_adf_cc:368:60)>
                      *)&local_1508);
          if (pvVar7 != (pointer)0x0) {
            operator_delete(pvVar7);
          }
          if (pvVar6 != (pointer)0x0) {
            operator_delete(pvVar6);
          }
          if (pfVar5 != (pointer)0x0) {
            operator_delete(pfVar5);
          }
          if (pfVar4 != (pointer)0x0) {
            operator_delete(pfVar4);
          }
          if (ppeVar3 != (pointer)0x0) {
            operator_delete(ppeVar3);
          }
          if (pfVar2 != (pointer)0x0) {
            operator_delete(pfVar2);
          }
          if (pfVar1 != (pointer)0x0) {
            operator_delete(pfVar1);
          }
          if (local_12b8.ex_costs.
              super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.ex_costs.
                            super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_12b8.ex_as.
              super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.ex_as.
                            super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.max_costs.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.min_costs.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_12b8.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.gen_cs.mtr_ec_seq.
                            super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.top_actions.super__Vector_base<float,_std::allocator<float>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_12b8.scores.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          local_1598 = local_1598 + 1;
        } while (local_1598 != __last);
      }
      if (local_970.ex_costs.
          super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_970.ex_costs.
                        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_970.ex_as.
          super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_970.ex_as.
                        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_970.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_970.max_costs.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_970.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_970.min_costs.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_970.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_970.gen_cs.mtr_ec_seq.
                        super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_970.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_970.top_actions.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if (local_970.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_970.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e10.ex_costs.
        super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.ex_costs.
                      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e10.ex_as.
        super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.ex_as.
                      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e10.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e10.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e10.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.gen_cs.mtr_ec_seq.
                      super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_e10.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.top_actions.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_e10.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e10.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_1068.ex_costs.
      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.ex_costs.
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1068.ex_as.
      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.ex_as.
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1068.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1068.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1068.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.gen_cs.mtr_ec_seq.
                    super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1068.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_1068.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1068.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bc0.ex_costs.
      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.ex_costs.
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_bc0.ex_as.
      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.ex_as.
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bc0.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.gen_cs.mtr_ec_seq.
                    super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bc0.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720.ex_costs.
      super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.ex_costs.
                    super__Vector_base<v_array<CB::cb_class>,_std::allocator<v_array<CB::cb_class>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_720.ex_as.
      super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.ex_as.
                    super__Vector_base<v_array<ACTION_SCORE::action_score>,_std::allocator<v_array<ACTION_SCORE::action_score>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_720.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.max_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.min_costs.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720.gen_cs.mtr_ec_seq.super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.gen_cs.mtr_ec_seq.
                    super__Vector_base<example_*,_std::allocator<example_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.top_actions.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_720.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_720.scores.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void do_sort(cb_explore_adf& data)
{
  // We want to preserve the score order in the returned action_probs if possible.  To do this,
  // sort top_actions and data.action_probs by the order induced in data.scores.
  sort(data.action_probs.begin(), data.action_probs.end(), [data](action_score as1, action_score as2) {
    if (as1.score > as2.score)
      return true;
    else if (as1.score < as2.score)
      return false;
    // equal probabilities
    if (data.scores[as1.action] < data.scores[as2.action])
      return true;
    else if (data.scores[as1.action] > data.scores[as2.action])
      return false;
    // equal probabilities and equal cost estimates
    return as1.action < as2.action;
  });
}